

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.h
# Opt level: O0

_Node * __thiscall
skiwi::
combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
::_FindLocalItem(combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
                 *this,uint64_t _Key,size_t *_PIndex)

{
  __pointer_type local_30;
  _Node *_CurrentNode;
  size_t *_PIndex_local;
  uint64_t _Key_local;
  combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
  *this_local;
  
  if (_PIndex == (size_t *)0x0) {
    __assert_fail("_PIndex != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/concurrency.h"
                  ,0x193,
                  "_Node *skiwi::combinable<std::vector<skiwi::(anonymous namespace)::compiler_data_memento>>::_FindLocalItem(uint64_t, size_t *) [_Ty = std::vector<skiwi::(anonymous namespace)::compiler_data_memento>]"
                 );
  }
  *_PIndex = _Key % this->_M_size;
  local_30 = std::atomic::operator_cast_to__Node_((atomic *)(this->_M_buckets + *_PIndex));
  while( true ) {
    if (local_30 == (__pointer_type)0x0) {
      return (_Node *)0x0;
    }
    if (local_30->_M_key == _Key) break;
    local_30 = local_30->_M_chain;
  }
  return local_30;
}

Assistant:

_Node* _FindLocalItem(uint64_t _Key, size_t* _PIndex)
      {
      assert(_PIndex != nullptr);

      *_PIndex = _Key % _M_size;

      // Search at this index for an existing value.
      for (_Node* _CurrentNode = _M_buckets[*_PIndex]; _CurrentNode != nullptr; _CurrentNode = _CurrentNode->_M_chain)
        {
        if (_CurrentNode->_M_key == _Key)
          {
          return _CurrentNode;
          }
        }

      return nullptr;
      }